

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

void __thiscall leveldb::Version::LevelFileNumIterator::SeekToLast(LevelFileNumIterator *this)

{
  long lVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  uint32_t uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppFVar2 = (this->flist_->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  ppFVar3 = (this->flist_->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar4 = 0;
  if (ppFVar2 != ppFVar3) {
    uVar4 = (int)((ulong)((long)ppFVar2 - (long)ppFVar3) >> 3) - 1;
  }
  this->index_ = uVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToLast() override {
    index_ = flist_->empty() ? 0 : flist_->size() - 1;
  }